

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall chrono::ChVariablesNode::ArchiveOUT(ChVariablesNode *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChVariablesNode>(marchive);
  local_28._value = &this->mass;
  local_28._name = "mass";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChVariablesNode::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChVariablesNode>();
    // serialize parent class
    ChVariables::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(mass);
}